

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilCountPairsOnePrint(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  int iVar1;
  uint i_00;
  uint k_00;
  int local_28;
  int local_24;
  int Index2;
  int Index1;
  int k;
  int i;
  Vec_Int_t *vSupport_local;
  Extra_BitMat_t *pMat_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vSupport), local_24 < iVar1; local_24 = local_24 + 1) {
    i_00 = Vec_IntEntry(vSupport,local_24);
    local_28 = local_24;
    while( true ) {
      local_28 = local_28 + 1;
      iVar1 = Vec_IntSize(vSupport);
      if (iVar1 <= local_28) break;
      k_00 = Vec_IntEntry(vSupport,local_28);
      iVar1 = Extra_BitMatrixLookup1(pMat,i_00,k_00);
      if (iVar1 != 0) {
        printf("(%d,%d) ",(ulong)i_00,(ulong)k_00);
      }
    }
  }
  return 0;
}

Assistant:

int Sim_UtilCountPairsOnePrint( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        if ( Extra_BitMatrixLookup1( pMat, i, k ) )
            printf( "(%d,%d) ", i, k );
    return 0;
}